

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O1

void __thiscall
slang::ast::ASTContext::evalRangeDimension
          (ASTContext *this,SelectorSyntax *syntax,bool isPacked,EvaluatedDimension *result)

{
  SyntaxKind SVar1;
  SymbolKind SVar2;
  int iVar3;
  Type *type;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  optional<int> oVar6;
  optional<int> oVar7;
  Diagnostic *this_00;
  DiagCode code;
  long lVar8;
  RangeSelectSyntax *rangeSyntax;
  SourceRange SVar9;
  unsigned_long local_30;
  Expression *expr;
  
  SVar1 = (syntax->super_SyntaxNode).kind;
  if (SVar1 == SimpleRangeSelect) {
    iVar5 = Expression::bind((int)*(undefined8 *)&syntax[1].super_SyntaxNode,(sockaddr *)this,0);
    oVar7 = evalInteger(this,(Expression *)CONCAT44(extraout_var_00,iVar5),
                        (bitmask<slang::ast::EvalFlags>)0x0);
    iVar5 = Expression::bind((int)*(undefined8 *)&syntax[2].super_SyntaxNode,(sockaddr *)this,0);
    oVar6 = evalInteger(this,(Expression *)CONCAT44(extraout_var_01,iVar5),
                        (bitmask<slang::ast::EvalFlags>)0x0);
    if (((ulong)oVar7.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> >> 0x20 & 1) == 0) {
      return;
    }
    if (((ulong)oVar6.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> & 0x100000000) == 0) {
      return;
    }
    result->kind = Range;
    result->range =
         (ConstantRange)
         ((ulong)oVar7.super__Optional_base<int,_true,_true>._M_payload.
                 super__Optional_payload_base<int> & 0xffffffff |
         (long)oVar6.super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int> << 0x20);
    goto LAB_0026c55e;
  }
  if (SVar1 == BitSelect) {
    iVar5 = Expression::bind((int)*(undefined8 *)&syntax[1].super_SyntaxNode,(sockaddr *)this,4);
    expr = (Expression *)CONCAT44(extraout_var,iVar5);
    if (expr->kind == DataType) {
      result->kind = Associative;
      type = (expr->type).ptr;
      result->associativeType = type;
      SVar2 = (type->super_Symbol).kind;
      if ((SVar2 - PackedStructType < 4) || (SVar2 == EnumType)) {
        SVar9 = expr->sourceRange;
        code.subsystem = Types;
        code.code = 1;
        goto LAB_0026c4db;
      }
      bVar4 = checkIndexType(type);
      if (!bVar4) {
        addDiag(this,(DiagCode)0xd0009,expr->sourceRange);
      }
    }
    else {
      oVar7 = evalInteger(this,expr,(bitmask<slang::ast::EvalFlags>)0x0);
      SVar9 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
      if (((ulong)oVar7.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int> >> 0x20 & 1) == 0) {
        return;
      }
      if (oVar7.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_payload < 1) {
        code.subsystem = Numeric;
        code.code = 8;
        goto LAB_0026c4db;
      }
      result->kind = AbbreviatedRange;
      result->range =
           (ConstantRange)
           (((long)oVar7.super__Optional_base<int,_true,_true>._M_payload.
                   super__Optional_payload_base<int> << 0x20) + -0x100000000);
    }
LAB_0026c55e:
    if (result->kind - Range < 2) {
      if (result->kind != AbbreviatedRange || !isPacked) {
        iVar5 = (result->range).left;
        iVar3 = (result->range).right;
        lVar8 = (long)iVar3 - (long)iVar5;
        if (iVar3 < iVar5) {
          lVar8 = (long)iVar5 - (long)iVar3;
        }
        local_30 = lVar8 + 1;
        if (local_30 < 0x1000000 || !isPacked) {
          if (local_30 >> 0x1f == 0 || isPacked) {
            return;
          }
          SVar9 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
          this_00 = addDiag(this,(DiagCode)0x9,SVar9);
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          ::emplace_back<unsigned_long>(&this_00->args,&local_30);
          local_30 = 0x7fffffff;
        }
        else {
          SVar9 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
          this_00 = addDiag(this,(DiagCode)0x1d0009,SVar9);
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          ::emplace_back<unsigned_long>(&this_00->args,&local_30);
          local_30 = 0xffffff;
        }
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<long>(&this_00->args,(long *)&local_30);
      }
      else {
        SVar9 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
        addDiag(this,(DiagCode)0x960006,SVar9);
      }
      result->kind = Unknown;
    }
    return;
  }
  SVar9 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
  code.subsystem = Declarations;
  code.code = 0x58;
LAB_0026c4db:
  addDiag(this,code,SVar9);
  return;
}

Assistant:

void ASTContext::evalRangeDimension(const SelectorSyntax& syntax, bool isPacked,
                                    EvaluatedDimension& result) const {
    switch (syntax.kind) {
        case SyntaxKind::BitSelect: {
            auto& expr = Expression::bind(*syntax.as<BitSelectSyntax>().expr, *this,
                                          ASTFlags::AllowDataType);

            // If this expression is actually a data type, this is an associative array dimension
            // instead of a normal packed / unpacked array.
            if (expr.kind == ExpressionKind::DataType) {
                result.kind = DimensionKind::Associative;
                result.associativeType = expr.as<DataTypeExpression>().type;
                switch (result.associativeType->kind) {
                    case SymbolKind::PackedStructType:
                    case SymbolKind::PackedUnionType:
                    case SymbolKind::UnpackedStructType:
                    case SymbolKind::UnpackedUnionType:
                    case SymbolKind::EnumType:
                        addDiag(diag::CannotDeclareType, expr.sourceRange);
                        return;
                    default:
                        break;
                }

                // It's invalid for the index type to be floating or having floating members.
                if (!checkIndexType(*result.associativeType))
                    addDiag(diag::InvalidAssociativeIndexType, expr.sourceRange);
            }
            else {
                auto value = evalInteger(expr);
                if (!requireGtZero(value, syntax.sourceRange()))
                    return;

                result.kind = DimensionKind::AbbreviatedRange;
                result.range = {0, *value - 1};
            }
            break;
        }
        case SyntaxKind::SimpleRangeSelect: {
            auto& rangeSyntax = syntax.as<RangeSelectSyntax>();
            auto left = evalInteger(*rangeSyntax.left);
            auto right = evalInteger(*rangeSyntax.right);
            if (!left || !right)
                return;

            result.kind = DimensionKind::Range;
            result.range = {*left, *right};
            break;
        }
        default:
            addDiag(diag::InvalidDimensionRange, syntax.sourceRange());
            return;
    }

    if (result.isRange()) {
        if (isPacked && result.kind == DimensionKind::AbbreviatedRange) {
            addDiag(diag::PackedDimsRequireFullRange, syntax.sourceRange());
            result.kind = DimensionKind::Unknown;
        }
        else {
            auto fullWidth = result.range.fullWidth();
            if (isPacked && fullWidth > SVInt::MAX_BITS) {
                addDiag(diag::PackedTypeTooLarge, syntax.sourceRange())
                    << fullWidth << (int)SVInt::MAX_BITS;
                result.kind = DimensionKind::Unknown;
            }
            else if (!isPacked && fullWidth > INT32_MAX) {
                addDiag(diag::ArrayDimTooLarge, syntax.sourceRange()) << fullWidth << INT32_MAX;
                result.kind = DimensionKind::Unknown;
            }
        }
    }
}